

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::ashr(SVInt *this,SVInt *rhs)

{
  SVInt *in_RDX;
  SVInt SVar2;
  undefined8 uVar1;
  
  if ((rhs->super_SVIntStorage).signFlag == false) {
    SVar2 = lshr(this,rhs);
    uVar1 = SVar2.super_SVIntStorage._8_8_;
  }
  else if ((in_RDX->super_SVIntStorage).unknownFlag == true) {
    SVar2 = createFillX(this,(rhs->super_SVIntStorage).bitWidth,true);
    uVar1 = SVar2.super_SVIntStorage._8_8_;
  }
  else {
    unsignedAmount(in_RDX);
    SVar2 = ashr(this,(bitwidth_t)rhs);
    uVar1 = SVar2.super_SVIntStorage._8_8_;
  }
  SVar2.super_SVIntStorage.bitWidth = (int)uVar1;
  SVar2.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar1 >> 0x20);
  SVar2.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar1 >> 0x28);
  SVar2.super_SVIntStorage._14_2_ = (short)((ulong)uVar1 >> 0x30);
  SVar2.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar2.super_SVIntStorage;
}

Assistant:

SVInt SVInt::ashr(const SVInt& rhs) const {
    if (!signFlag)
        return lshr(rhs);
    if (rhs.hasUnknown())
        return createFillX(bitWidth, signFlag);

    return ashr(rhs.unsignedAmount());
}